

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Reference::MutateString(Reference *this,char *str)

{
  size_t __n;
  bool bVar1;
  String s;
  String local_40;
  
  __n = strlen(str);
  AsString(&local_40,this);
  bVar1 = local_40.super_Sized.super_Object.data_ != String::EmptyString()::empty_string;
  if (local_40.super_Sized.size_ == __n && bVar1) {
    memcpy(local_40.super_Sized.super_Object.data_,str,__n);
  }
  return local_40.super_Sized.size_ == __n && bVar1;
}

Assistant:

bool MutateString(const char *str) { return MutateString(str, strlen(str)); }